

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

int PKCS12_parse(PKCS12 *p12,char *pass,EVP_PKEY **pkey,X509 **cert,stack_st_X509 **ca)

{
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  X509 *x509;
  size_t i;
  OPENSSL_STACK *pOVar3;
  CBS ber_bytes;
  CBS local_40;
  
  if (ca == (stack_st_X509 **)0x0) {
    pOVar3 = (OPENSSL_STACK *)0x0;
  }
  else {
    pOVar3 = (OPENSSL_STACK *)*ca;
  }
  sk = pOVar3;
  if ((pOVar3 == (OPENSSL_STACK *)0x0) && (sk = OPENSSL_sk_new_null(), sk == (OPENSSL_STACK *)0x0))
  {
    iVar1 = 0;
  }
  else {
    local_40.data = (uint8_t *)p12->version;
    local_40.len = (size_t)p12->mac;
    iVar1 = PKCS12_get_key_and_certs((EVP_PKEY **)pkey,(stack_st_X509 *)sk,&local_40,pass);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (pOVar3 == (OPENSSL_STACK *)0x0) {
        OPENSSL_sk_free(sk);
        iVar1 = 0;
      }
    }
    else {
      *cert = (X509 *)0x0;
      sVar2 = OPENSSL_sk_num(sk);
      i = sVar2;
      if (sVar2 != 0 && *pkey != (EVP_PKEY *)0x0) {
        while (i = i - 1, i < sVar2) {
          x509 = (X509 *)OPENSSL_sk_value(sk,i);
          iVar1 = X509_check_private_key(x509,*pkey);
          if (iVar1 != 0) {
            *cert = x509;
            OPENSSL_sk_delete(sk,i);
            break;
          }
          ERR_clear_error();
        }
      }
      if (ca == (stack_st_X509 **)0x0) {
        OPENSSL_sk_pop_free_ex(sk,sk_X509_call_free_func,X509_free);
      }
      else {
        *ca = (stack_st_X509 *)sk;
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int PKCS12_parse(const PKCS12 *p12, const char *password, EVP_PKEY **out_pkey,
                 X509 **out_cert, STACK_OF(X509) **out_ca_certs) {
  CBS ber_bytes;
  STACK_OF(X509) *ca_certs = NULL;
  char ca_certs_alloced = 0;

  if (out_ca_certs != NULL && *out_ca_certs != NULL) {
    ca_certs = *out_ca_certs;
  }

  if (!ca_certs) {
    ca_certs = sk_X509_new_null();
    if (ca_certs == NULL) {
      return 0;
    }
    ca_certs_alloced = 1;
  }

  CBS_init(&ber_bytes, p12->ber_bytes, p12->ber_len);
  if (!PKCS12_get_key_and_certs(out_pkey, ca_certs, &ber_bytes, password)) {
    if (ca_certs_alloced) {
      sk_X509_free(ca_certs);
    }
    return 0;
  }

  // OpenSSL selects the last certificate which matches the private key as
  // |out_cert|.
  *out_cert = NULL;
  size_t num_certs = sk_X509_num(ca_certs);
  if (*out_pkey != NULL && num_certs > 0) {
    for (size_t i = num_certs - 1; i < num_certs; i--) {
      X509 *cert = sk_X509_value(ca_certs, i);
      if (X509_check_private_key(cert, *out_pkey)) {
        *out_cert = cert;
        sk_X509_delete(ca_certs, i);
        break;
      }
      ERR_clear_error();
    }
  }

  if (out_ca_certs) {
    *out_ca_certs = ca_certs;
  } else {
    sk_X509_pop_free(ca_certs, X509_free);
  }

  return 1;
}